

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_private(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uchar *input,uchar *output)

{
  mbedtls_mpi *Y;
  mbedtls_mpi *X;
  mbedtls_mpi *G;
  int iVar1;
  int iVar2;
  mbedtls_mpi *B;
  mbedtls_mpi *B_00;
  mbedtls_mpi T;
  mbedtls_mpi TP;
  mbedtls_mpi R;
  mbedtls_mpi TQ;
  mbedtls_mpi C;
  mbedtls_mpi I;
  mbedtls_mpi DP_blind;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi DQ_blind;
  
  iVar1 = rsa_check_context(ctx,1,(int)p_rng);
  if (iVar1 != 0) {
    return -0x4080;
  }
  mbedtls_mpi_init(&T);
  mbedtls_mpi_init(&P1);
  mbedtls_mpi_init(&Q1);
  mbedtls_mpi_init(&R);
  if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    mbedtls_mpi_init(&DP_blind);
    mbedtls_mpi_init(&DQ_blind);
  }
  mbedtls_mpi_init(&TP);
  mbedtls_mpi_init(&TQ);
  mbedtls_mpi_init(&I);
  mbedtls_mpi_init(&C);
  iVar1 = mbedtls_mpi_read_binary(&T,input,ctx->len);
  if (iVar1 == 0) {
    Y = &ctx->N;
    iVar1 = mbedtls_mpi_cmp_mpi(&T,Y);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_copy(&I,&T);
      if (iVar1 == 0) {
        B_00 = &ctx->DP;
        B = &ctx->DQ;
        if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
          X = &ctx->Vf;
          G = &ctx->Vi;
          if ((ctx->Vf).p == (mbedtls_mpi_uint *)0x0) {
            iVar2 = 0xc;
            do {
              iVar2 = iVar2 + -1;
              if (iVar2 == 0) {
                iVar1 = -0x4480;
                goto LAB_0010cd59;
              }
              iVar1 = mbedtls_mpi_fill_random(X,ctx->len - 1,f_rng,p_rng);
              if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_gcd(G,X,Y), iVar1 != 0)) goto LAB_0010cd59;
              iVar1 = mbedtls_mpi_cmp_int(G,1);
            } while (iVar1 != 0);
            iVar1 = mbedtls_mpi_inv_mod(G,X,Y);
            if (iVar1 != 0) goto LAB_0010cd59;
            iVar1 = mbedtls_mpi_exp_mod(G,G,&ctx->E,Y,&ctx->RN);
          }
          else {
            iVar1 = mbedtls_mpi_mul_mpi(G,G,G);
            if (((iVar1 != 0) || (iVar1 = mbedtls_mpi_mod_mpi(G,G,Y), iVar1 != 0)) ||
               (iVar1 = mbedtls_mpi_mul_mpi(X,X,X), iVar1 != 0)) goto LAB_0010cd59;
            iVar1 = mbedtls_mpi_mod_mpi(X,X,Y);
          }
          if (((((iVar1 != 0) || (iVar1 = mbedtls_mpi_mul_mpi(&T,&T,G), iVar1 != 0)) ||
               ((iVar1 = mbedtls_mpi_mod_mpi(&T,&T,Y), iVar1 != 0 ||
                ((iVar1 = mbedtls_mpi_sub_int(&P1,&ctx->P,1), iVar1 != 0 ||
                 (iVar1 = mbedtls_mpi_sub_int(&Q1,&ctx->Q,1), iVar1 != 0)))))) ||
              (iVar1 = mbedtls_mpi_fill_random(&R,0x1c,f_rng,p_rng), iVar1 != 0)) ||
             (iVar1 = mbedtls_mpi_mul_mpi(&DP_blind,&P1,&R), iVar1 != 0)) goto LAB_0010cd59;
          iVar1 = mbedtls_mpi_add_mpi(&DP_blind,&DP_blind,B_00);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_fill_random(&R,0x1c,f_rng,p_rng), iVar1 != 0))
          goto LAB_0010cd59;
          iVar1 = mbedtls_mpi_mul_mpi(&DQ_blind,&Q1,&R);
          if ((iVar1 != 0) ||
             (iVar1 = mbedtls_mpi_add_mpi(&DQ_blind,&DQ_blind,B), B = &DQ_blind, B_00 = &DP_blind,
             iVar1 != 0)) goto LAB_0010cd59;
        }
        iVar1 = mbedtls_mpi_exp_mod(&TP,&T,B_00,&ctx->P,&ctx->RP);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_exp_mod(&TQ,&T,B,&ctx->Q,&ctx->RQ);
          if ((((((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_mpi(&T,&TP,&TQ), iVar1 == 0)) &&
                (iVar1 = mbedtls_mpi_mul_mpi(&TP,&T,&ctx->QP), iVar1 == 0)) &&
               ((iVar1 = mbedtls_mpi_mod_mpi(&T,&TP,&ctx->P), iVar1 == 0 &&
                (iVar1 = mbedtls_mpi_mul_mpi(&TP,&T,&ctx->Q), iVar1 == 0)))) &&
              (iVar1 = mbedtls_mpi_add_mpi(&T,&TQ,&TP), iVar1 == 0)) &&
             (((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
               ((iVar1 = mbedtls_mpi_mul_mpi(&T,&T,&ctx->Vf), iVar1 == 0 &&
                (iVar1 = mbedtls_mpi_mod_mpi(&T,&T,Y), iVar1 == 0)))) &&
              (iVar1 = mbedtls_mpi_exp_mod(&C,&T,&ctx->E,Y,&ctx->RN), iVar1 == 0)))) {
            iVar2 = mbedtls_mpi_cmp_mpi(&C,&I);
            iVar1 = -0x4380;
            if (iVar2 == 0) {
              iVar1 = mbedtls_mpi_write_binary(&T,output,ctx->len);
            }
          }
        }
      }
    }
    else {
      iVar1 = -4;
    }
  }
LAB_0010cd59:
  mbedtls_mpi_free(&P1);
  mbedtls_mpi_free(&Q1);
  mbedtls_mpi_free(&R);
  if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    mbedtls_mpi_free(&DP_blind);
    mbedtls_mpi_free(&DQ_blind);
  }
  mbedtls_mpi_free(&T);
  mbedtls_mpi_free(&TP);
  mbedtls_mpi_free(&TQ);
  mbedtls_mpi_free(&C);
  mbedtls_mpi_free(&I);
  iVar2 = iVar1 + -0x4300;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_private( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 const unsigned char *input,
                 unsigned char *output )
{
    int ret;
    size_t olen;

    /* Temporary holding the result */
    mbedtls_mpi T;

    /* Temporaries holding P-1, Q-1 and the
     * exponent blinding factor, respectively. */
    mbedtls_mpi P1, Q1, R;

#if !defined(MBEDTLS_RSA_NO_CRT)
    /* Temporaries holding the results mod p resp. mod q. */
    mbedtls_mpi TP, TQ;

    /* Temporaries holding the blinded exponents for
     * the mod p resp. mod q computation (if used). */
    mbedtls_mpi DP_blind, DQ_blind;

    /* Pointers to actual exponents to be used - either the unblinded
     * or the blinded ones, depending on the presence of a PRNG. */
    mbedtls_mpi *DP = &ctx->DP;
    mbedtls_mpi *DQ = &ctx->DQ;
#else
    /* Temporary holding the blinded exponent (if used). */
    mbedtls_mpi D_blind;

    /* Pointer to actual exponent to be used - either the unblinded
     * or the blinded one, depending on the presence of a PRNG. */
    mbedtls_mpi *D = &ctx->D;
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Temporaries holding the initial input and the double
     * checked result; should be the same in the end. */
    mbedtls_mpi I, C;

    if( rsa_check_context( ctx, 1             /* private key checks */,
                                f_rng != NULL /* blinding y/n       */ ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /* MPI Initialization */
    mbedtls_mpi_init( &T );

    mbedtls_mpi_init( &P1 );
    mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &R );

    if( f_rng != NULL )
    {
#if defined(MBEDTLS_RSA_NO_CRT)
        mbedtls_mpi_init( &D_blind );
#else
        mbedtls_mpi_init( &DP_blind );
        mbedtls_mpi_init( &DQ_blind );
#endif
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_init( &TP ); mbedtls_mpi_init( &TQ );
#endif

    mbedtls_mpi_init( &I );
    mbedtls_mpi_init( &C );

    /* End of MPI initialization */

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &T, input, ctx->len ) );
    if( mbedtls_mpi_cmp_mpi( &T, &ctx->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &I, &T ) );

    if( f_rng != NULL )
    {
        /*
         * Blinding
         * T = T * Vi mod N
         */
        MBEDTLS_MPI_CHK( rsa_prepare_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );

        /*
         * Exponent blinding
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );

#if defined(MBEDTLS_RSA_NO_CRT)
        /*
         * D_blind = ( P - 1 ) * ( Q - 1 ) * R + D
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &D_blind, &P1, &Q1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &D_blind, &D_blind, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &D_blind, &D_blind, &ctx->D ) );

        D = &D_blind;
#else
        /*
         * DP_blind = ( P - 1 ) * R + DP
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DP_blind, &P1, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &DP_blind, &DP_blind,
                    &ctx->DP ) );

        DP = &DP_blind;

        /*
         * DQ_blind = ( Q - 1 ) * R + DQ
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &R, RSA_EXPONENT_BLINDING,
                         f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DQ_blind, &Q1, &R ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &DQ_blind, &DQ_blind,
                    &ctx->DQ ) );

        DQ = &DQ_blind;
#endif /* MBEDTLS_RSA_NO_CRT */
    }

#if defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &T, &T, D, &ctx->N, &ctx->RN ) );
#else
    /*
     * Faster decryption using the CRT
     *
     * TP = input ^ dP mod P
     * TQ = input ^ dQ mod Q
     */

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &TP, &T, DP, &ctx->P, &ctx->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &TQ, &T, DQ, &ctx->Q, &ctx->RQ ) );

    /*
     * T = (TP - TQ) * (Q^-1 mod P) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T, &TP, &TQ ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &TP, &T, &ctx->QP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &TP, &ctx->P ) );

    /*
     * T = TQ + T * Q
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &TP, &T, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T, &TQ, &TP ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    if( f_rng != NULL )
    {
        /*
         * Unblind
         * T = T * Vf mod N
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &T, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &T, &T, &ctx->N ) );
    }

    /* Verify the result to prevent glitching attacks. */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &C, &T, &ctx->E,
                                          &ctx->N, &ctx->RN ) );
    if( mbedtls_mpi_cmp_mpi( &C, &I ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &T, output, olen ) );

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    mbedtls_mpi_free( &P1 );
    mbedtls_mpi_free( &Q1 );
    mbedtls_mpi_free( &R );

    if( f_rng != NULL )
    {
#if defined(MBEDTLS_RSA_NO_CRT)
        mbedtls_mpi_free( &D_blind );
#else
        mbedtls_mpi_free( &DP_blind );
        mbedtls_mpi_free( &DQ_blind );
#endif
    }

    mbedtls_mpi_free( &T );

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free( &TP ); mbedtls_mpi_free( &TQ );
#endif

    mbedtls_mpi_free( &C );
    mbedtls_mpi_free( &I );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_PRIVATE_FAILED + ret );

    return( 0 );
}